

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O2

void info_print_snode(lyout *out,lys_node *parent,lys_node *node,char *label)

{
  size_t sVar1;
  lys_node *plVar2;
  char *pcVar3;
  char *format;
  
  sVar1 = strlen(label);
  if (9 < sVar1) {
    __assert_fail("strlen(label) < INDENT_LEN-1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_info.c"
                  ,0x43,
                  "void info_print_snode(struct lyout *, const struct lys_node *, const struct lys_node *, const char *)"
                 );
  }
  ly_print(out,"%-*s",0xb,label);
  if (node != (lys_node *)0x0) {
    pcVar3 = "output";
    if (node->name == (char *)0x0) {
      if (node->nodetype == LYS_INPUT) {
        pcVar3 = "input";
      }
      format = "%s\n";
    }
    else {
      pcVar3 = strnodetype(node->nodetype);
      ly_print(out,"%s \"",pcVar3);
      plVar2 = lys_parent(node);
      if (plVar2 != parent) {
        ly_print(out,"%s:",node->module->prefix);
      }
      pcVar3 = node->name;
      format = "%s\"\n";
    }
    ly_print(out,format,pcVar3);
    while (node = node->next, node != (lys_node *)0x0) {
      if (node->name == (char *)0x0) {
        pcVar3 = "output";
        if (node->nodetype == LYS_INPUT) {
          pcVar3 = "input";
        }
        ly_print(out,"%*s%s\n",0xb,"",pcVar3);
      }
      else {
        pcVar3 = strnodetype(node->nodetype);
        ly_print(out,"%*s%s \"",0xb,"",pcVar3);
        plVar2 = lys_parent(node);
        if (plVar2 != parent) {
          ly_print(out,"%s:",node->module->prefix);
        }
        ly_print(out,"%s\"\n",node->name);
      }
    }
    return;
  }
  ly_print(out,"\n");
  return;
}

Assistant:

static void
info_print_snode(struct lyout *out, const struct lys_node *parent, const struct lys_node *node, const char *label)
{
    assert(strlen(label) < INDENT_LEN-1);

    ly_print(out, "%-*s", INDENT_LEN, label);

    if (node) {
        if (node->name) {
            ly_print(out, "%s \"", strnodetype(node->nodetype));
            if (parent != lys_parent(node)) {
                ly_print(out, "%s:", node->module->prefix);
            }
            ly_print(out, "%s\"\n", node->name);
        } else {
            ly_print(out, "%s\n", (node->nodetype == LYS_INPUT ? "input" : "output"));
        }
        node = node->next;
        for (; node; node = node->next) {
            if (node->name) {
                ly_print(out, "%*s%s \"", INDENT_LEN, "", strnodetype(node->nodetype));
                if (parent != lys_parent(node)) {
                    ly_print(out, "%s:", node->module->prefix);
                }
                ly_print(out, "%s\"\n", node->name);
            } else {
                ly_print(out, "%*s%s\n", INDENT_LEN, "", (node->nodetype == LYS_INPUT ? "input" : "output"));
            }
        }
    } else {
        ly_print(out, "\n");
    }
}